

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              size_t size,char **err)

{
  char **ppcVar1;
  EXRVersion *pEVar2;
  pointer pHVar3;
  EXRHeader ***pppEVar4;
  long *plVar5;
  undefined8 uVar6;
  undefined4 in_EAX;
  int iVar7;
  char *pcVar8;
  EXRHeader **ppEVar9;
  EXRHeader *exr_header;
  pointer pHVar10;
  uchar *buf;
  int iVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  bool empty_header;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  string err_str;
  bool local_13d;
  int local_13c;
  char **local_138;
  EXRVersion *local_130;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> local_128;
  string local_108;
  int *local_e8;
  EXRHeader ***local_e0;
  long *local_d8 [2];
  long local_c8 [2];
  undefined1 local_b8 [24];
  pointer p_Stack_a0;
  pointer local_98;
  pointer p_Stack_90;
  int local_88 [18];
  ulong uStack_40;
  
  auVar15._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar15._4_4_ = -(uint)(memory == (uchar *)0x0);
  auVar15._8_4_ = -(uint)(num_headers == (int *)0x0);
  auVar15._12_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  iVar7 = movmskps(in_EAX,auVar15);
  if (iVar7 == 0) {
    local_e0 = exr_headers;
    if (size < 8) {
      local_b8._0_8_ = (pointer)(local_b8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Data size too short","");
      uVar6 = local_b8._0_8_;
      if (err != (char **)0x0) {
        pcVar8 = strdup((char *)local_b8._0_8_);
        *err = pcVar8;
      }
      if ((pointer)uVar6 != (pointer)(local_b8 + 0x10)) {
        operator_delete((void *)uVar6,
                        (ulong)((long)&(((string *)local_b8._16_8_)->_M_dataplus)._M_p + 1));
      }
      iVar7 = -4;
    }
    else {
      buf = memory + 8;
      local_128.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_128.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128.super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138 = err;
      local_130 = exr_version;
      local_e8 = num_headers;
      do {
        local_88[0x10] = 0;
        local_88[0x11] = 0;
        uStack_40 = 0;
        local_88[0xc] = 0;
        local_88[0xd] = 0;
        local_88[0xe] = 0;
        local_88[0xf] = 0;
        local_88[8] = 0;
        local_88[9] = 0;
        local_88[10] = 0;
        local_88[0xb] = 0;
        local_88[4] = 0;
        local_88[5] = 0;
        local_88[6] = 0;
        local_88[7] = 0;
        local_88[0] = 0;
        local_88[1] = 0;
        local_88[2] = 0;
        local_88[3] = 0;
        local_98 = (pointer)0x0;
        p_Stack_90 = (pointer)0x0;
        local_b8._16_8_ = (pointer)0x0;
        p_Stack_a0 = (pointer)0x0;
        local_b8._0_8_ = (pointer)0x0;
        local_b8._8_8_ = (pointer)0x0;
        local_108._M_string_length = 0;
        local_108.field_2._M_local_buf[0] = '\0';
        local_13d = false;
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        iVar7 = tinyexr::ParseEXRHeader
                          ((HeaderInfo *)local_b8,&local_13d,local_130,&local_108,buf,size - 8);
        ppcVar1 = local_138;
        if (iVar7 == 0) {
          if (local_13d == true) {
            buf = buf + 1;
            iVar11 = 2;
            iVar7 = local_13c;
          }
          else if (local_88[0xd] == 0) {
            local_d8[0] = local_c8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,"`chunkCount\' attribute is not found in the header.","");
            plVar5 = local_d8[0];
            ppcVar1 = local_138;
            if (local_138 != (char **)0x0) {
              pcVar8 = strdup((char *)local_d8[0]);
              *ppcVar1 = pcVar8;
            }
            if (plVar5 != local_c8) {
              operator_delete(plVar5,local_c8[0] + 1);
            }
            local_13c = -4;
            iVar11 = 1;
            iVar7 = local_13c;
          }
          else {
            std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                      (&local_128,(HeaderInfo *)local_b8);
            buf = buf + (uStack_40 & 0xffffffff);
            iVar11 = 0;
            iVar7 = local_13c;
          }
        }
        else {
          iVar11 = 1;
          if (local_138 != (char **)0x0) {
            pcVar8 = strdup(local_108._M_dataplus._M_p);
            *ppcVar1 = pcVar8;
          }
        }
        local_13c = iVar7;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,
                          CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                   local_108.field_2._M_local_buf[0]) + 1);
        }
        if (p_Stack_a0 != (pointer)0x0) {
          operator_delete(p_Stack_a0,(long)p_Stack_90 - (long)p_Stack_a0);
        }
        std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::~vector
                  ((vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *)local_b8);
        pHVar3 = local_128.
                 super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pHVar10 = local_128.
                  super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (iVar11 == 0);
      iVar7 = local_13c;
      if (iVar11 == 2) {
        lVar13 = (long)local_128.
                       super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_128.
                       super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        ppEVar9 = (EXRHeader **)malloc(lVar13 >> 4);
        pppEVar4 = local_e0;
        pEVar2 = local_130;
        *local_e0 = ppEVar9;
        if (pHVar3 == pHVar10) {
          uVar14 = lVar13 >> 7;
        }
        else {
          lVar13 = 0;
          uVar12 = 0;
          do {
            exr_header = (EXRHeader *)malloc(0x88);
            tinyexr::ConvertHeader
                      (exr_header,(HeaderInfo *)((long)pHVar10->data_window + lVar13 + -0x30));
            exr_header->tiled = pEVar2->tiled;
            (*pppEVar4)[uVar12] = exr_header;
            uVar12 = uVar12 + 1;
            uVar14 = (long)local_128.
                           super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_128.
                           super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 7;
            lVar13 = lVar13 + 0x80;
            pHVar10 = local_128.
                      super__Vector_base<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar12 < uVar14);
        }
        *local_e8 = (int)uVar14;
        iVar7 = 0;
      }
      std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector(&local_128);
    }
  }
  else {
    local_b8._0_8_ = (pointer)(local_b8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"Invalid argument for ParseEXRMultipartHeaderFromMemory","");
    uVar6 = local_b8._0_8_;
    if (err != (char **)0x0) {
      pcVar8 = strdup((char *)local_b8._0_8_);
      *err = pcVar8;
    }
    if ((pointer)uVar6 != (pointer)(local_b8 + 0x10)) {
      operator_delete((void *)uVar6,
                      (ulong)((long)&(((string *)local_b8._16_8_)->_M_dataplus)._M_p + 1));
    }
    iVar7 = -3;
  }
  return iVar7;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory, size_t size,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    tinyexr::SetErrorMessage(
        "Invalid argument for ParseEXRMultipartHeaderFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Data size too short", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {
      tinyexr::SetErrorMessage(err_str, err);
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {
      tinyexr::SetErrorMessage(
          "`chunkCount' attribute is not found in the header.", err);
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
    size -= info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));
  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));

    ConvertHeader(exr_header, infos[i]);

    // transfoer `tiled` from version.
    exr_header->tiled = exr_version->tiled;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return TINYEXR_SUCCESS;
}